

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::
     generateTransformFeedbackVariableBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)256>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool reducedSet)

{
  Node *pNVar1;
  SharedPtrStateBase *pSVar2;
  Node *pNVar3;
  ResourceTestCase *pRVar4;
  deInt32 *pdVar5;
  SharedPtr xfbTarget;
  SharedPtr variable;
  SharedPtr variable_1;
  SharedPtr output;
  SharedPtr defaultBlock;
  SharedPtr local_98;
  SharedPtr local_88;
  SharedPtr local_78;
  Node *local_68;
  SharedPtrStateBase *pSStack_60;
  Node *local_58;
  SharedPtrStateBase *pSStack_50;
  TestNode *local_48;
  Context *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  local_48 = &targetGroup->super_TestNode;
  local_40 = context;
  pNVar1 = (Node *)operator_new(0x20);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar1->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar1->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar2 = parentStructure->m_state;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1f90;
  pSStack_50 = (SharedPtrStateBase *)0x0;
  local_58 = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  pSStack_50 = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar3->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1fc8;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 1;
  pSStack_60 = (SharedPtrStateBase *)0x0;
  local_68 = pNVar3;
  pSStack_60 = (SharedPtrStateBase *)operator_new(0x20);
  pSStack_60->strongRefCount = 0;
  pSStack_60->weakRefCount = 0;
  pSStack_60->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSStack_60[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSStack_60->strongRefCount = 1;
  pSStack_60->weakRefCount = 1;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar1->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar1->m_enclosingNode).m_ptr = local_58;
  (pNVar1->m_enclosingNode).m_state = pSStack_50;
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b2a90;
  pNVar1[1]._vptr_Node = (_func_int **)0x1a3c266;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_88,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING
             ,0x100);
  ResourceTestCase::ResourceTestCase
            (pRVar4,local_40,&local_98,(ProgramResourceQueryTestTarget *)&local_88,
             "builtin_gl_position");
  tcu::TestNode::addChild(local_48,(TestNode *)pRVar4);
  pdVar5 = &pSVar2->strongRefCount;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    local_98.m_ptr = (Node *)0x0;
    (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar5 = &(local_98.m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    if (local_98.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_98.m_state = (SharedPtrStateBase *)0x0;
  }
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar1->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar1->m_enclosingNode).m_ptr = local_68;
  (pNVar1->m_enclosingNode).m_state = pSStack_60;
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_60->strongRefCount = pSStack_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b2a90;
  pNVar1[1]._vptr_Node = (_func_int **)0x0;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  local_88.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_78,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING
             ,0x100);
  ResourceTestCase::ResourceTestCase
            (pRVar4,local_40,&local_88,(ProgramResourceQueryTestTarget *)&local_78,
             "default_block_basic_type");
  tcu::TestNode::addChild(local_48,(TestNode *)pRVar4);
  pdVar5 = &pSVar2->strongRefCount;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    local_88.m_ptr = (Node *)0x0;
    (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar5 = &(local_88.m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_88.m_state = (SharedPtrStateBase *)0x0;
  }
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &(local_98.m_state)->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &(local_98.m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_98.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar1 = (Node *)operator_new(0x20);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar1->m_type = TYPE_STRUCT_MEMBER;
  (pNVar1->m_enclosingNode).m_ptr = local_68;
  (pNVar1->m_enclosingNode).m_state = pSStack_60;
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_60->strongRefCount = pSStack_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b20f8;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar3->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2a90;
  pNVar3[1]._vptr_Node = (_func_int **)0x0;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  local_88.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar1->m_type = TYPE_VARIABLE;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 4;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78.m_state = pSVar2;
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,0x100);
  ResourceTestCase::ResourceTestCase
            (pRVar4,local_40,&local_78,&local_38,"default_block_struct_member");
  tcu::TestNode::addChild(local_48,(TestNode *)pRVar4);
  pdVar5 = &pSVar2->strongRefCount;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    local_78.m_ptr = (Node *)0x0;
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar5 = &(local_78.m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_78.m_state = (SharedPtrStateBase *)0x0;
  }
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &(local_88.m_state)->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &(local_88.m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &(local_98.m_state)->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &(local_98.m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_98.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar1->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar1->m_enclosingNode).m_ptr = local_68;
  (pNVar1->m_enclosingNode).m_state = pSStack_60;
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_60->strongRefCount = pSStack_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b2a90;
  pNVar1[1]._vptr_Node = (_func_int **)0x0;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar3->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  local_88.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar1->m_type = TYPE_VARIABLE;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 4;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78.m_state = pSVar2;
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,0x100);
  ResourceTestCase::ResourceTestCase(pRVar4,local_40,&local_78,&local_38,"default_block_array");
  tcu::TestNode::addChild(local_48,(TestNode *)pRVar4);
  pdVar5 = &pSVar2->strongRefCount;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    local_78.m_ptr = (Node *)0x0;
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar5 = &(local_78.m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_78.m_state = (SharedPtrStateBase *)0x0;
  }
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &(local_88.m_state)->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &(local_88.m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &(local_98.m_state)->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &(local_98.m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_98.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar1->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar1->m_enclosingNode).m_ptr = local_68;
  (pNVar1->m_enclosingNode).m_state = pSStack_60;
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_60->strongRefCount = pSStack_60->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + 1;
    UNLOCK();
  }
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 0xffffffff;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_98.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_98.m_state = pSVar2;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar3->m_type = TYPE_TRANSFORM_FEEDBACK_TARGET;
  (pNVar3->m_enclosingNode).m_ptr = pNVar1;
  (pNVar3->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021b2a90;
  pNVar3[1]._vptr_Node = (_func_int **)0x0;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  local_88.m_ptr = pNVar3;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_88.m_state = pSVar2;
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar1->m_type = TYPE_VARIABLE;
  (pNVar1->m_enclosingNode).m_ptr = pNVar3;
  (pNVar1->m_enclosingNode).m_state = pSVar2;
  LOCK();
  pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar5 = &((pNVar1->m_enclosingNode).m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + 1;
  UNLOCK();
  pNVar1->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
  *(undefined4 *)&pNVar1[1]._vptr_Node = 4;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar1;
  pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar2->strongRefCount = 0;
  pSVar2->weakRefCount = 0;
  pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar1;
  pSVar2->strongRefCount = 1;
  pSVar2->weakRefCount = 1;
  local_78.m_state = pSVar2;
  pRVar4 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,0x100);
  ResourceTestCase::ResourceTestCase
            (pRVar4,local_40,&local_78,&local_38,"default_block_array_element");
  tcu::TestNode::addChild(local_48,(TestNode *)pRVar4);
  pdVar5 = &pSVar2->strongRefCount;
  LOCK();
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    local_78.m_ptr = (Node *)0x0;
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar5 = &(local_78.m_state)->weakRefCount;
  *pdVar5 = *pdVar5 + -1;
  UNLOCK();
  if (*pdVar5 == 0) {
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_78.m_state = (SharedPtrStateBase *)0x0;
  }
  if (local_88.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &(local_88.m_state)->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_88.m_ptr = (Node *)0x0;
      (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &(local_88.m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_88.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_98.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &(local_98.m_state)->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_98.m_ptr = (Node *)0x0;
      (*(local_98.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &(local_98.m_state)->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (local_98.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_98.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_98.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &pSStack_60->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_68 = (Node *)0x0;
      (*pSStack_60->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &pSStack_60->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      if (pSStack_60 != (SharedPtrStateBase *)0x0) {
        (*pSStack_60->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_60 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar5 = &pSStack_50->strongRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if (*pdVar5 == 0) {
      local_58 = (Node *)0x0;
      (*pSStack_50->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar5 = &pSStack_50->weakRefCount;
    *pdVar5 = *pdVar5 + -1;
    UNLOCK();
    if ((*pdVar5 == 0) && (pSStack_50 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_50->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateTransformFeedbackVariableBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool reducedSet)
{
	const ResourceDefinition::Node::SharedPtr	defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	output			(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_OUT));

	DE_UNREF(reducedSet);

	// .builtin_gl_position
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget(new ResourceDefinition::TransformFeedbackTarget(defaultBlock, "gl_Position"));
		targetGroup->addChild(new ResourceTestCase(context, xfbTarget, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "builtin_gl_position"));
	}
	// .default_block_basic_type
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_basic_type"));
	}
	// .default_block_struct_member
	{
		const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(structMbr));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_struct_member"));
	}
	// .default_block_array
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(xfbTarget));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_array"));
	}
	// .default_block_array_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(arrayElem));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, TargetProp), "default_block_array_element"));
	}
}